

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

string * StringForFeeEstimateHorizon_abi_cxx11_
                   (string *__return_storage_ptr__,FeeEstimateHorizon horizon)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (horizon == LONG_HALFLIFE) {
    __s = "long";
    __a = &local_13;
  }
  else if (horizon == MED_HALFLIFE) {
    __s = "medium";
    __a = &local_12;
  }
  else {
    if (horizon != SHORT_HALFLIFE) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                    ,0x2c,"std::string StringForFeeEstimateHorizon(FeeEstimateHorizon)");
    }
    __s = "short";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string StringForFeeEstimateHorizon(FeeEstimateHorizon horizon)
{
    switch (horizon) {
    case FeeEstimateHorizon::SHORT_HALFLIFE: return "short";
    case FeeEstimateHorizon::MED_HALFLIFE: return "medium";
    case FeeEstimateHorizon::LONG_HALFLIFE: return "long";
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}